

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceName
          (VClient *this,uint i_DeviceIndex,string *o_rDeviceName,Enum *o_rDeviceType)

{
  bool bVar1;
  size_type sVar2;
  string local_80;
  const_reference local_60;
  VDeviceInfo *rDevice;
  Enum local_44;
  undefined1 local_40 [4];
  Enum GetResult;
  scoped_lock Lock;
  Enum *o_rDeviceType_local;
  string *o_rDeviceName_local;
  uint i_DeviceIndex_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rDeviceType;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40,&this->m_FrameMutex);
  local_44 = Success;
  bVar1 = InitGet<std::__cxx11::string,ViconDataStreamSDK::Core::DeviceType::Enum>
                    (this,&local_44,o_rDeviceName,(Enum *)Lock._8_8_);
  if (bVar1) {
    sVar2 = std::vector<ViconCGStream::VDeviceInfo,_std::allocator<ViconCGStream::VDeviceInfo>_>::
            size(&(this->m_LatestFrame).m_Devices);
    if (i_DeviceIndex < sVar2) {
      local_60 = std::
                 vector<ViconCGStream::VDeviceInfo,_std::allocator<ViconCGStream::VDeviceInfo>_>::
                 operator[](&(this->m_LatestFrame).m_Devices,(ulong)i_DeviceIndex);
      ClientUtils::AdaptDeviceName(&local_80,&local_60->m_Name,local_60->m_DeviceID);
      std::__cxx11::string::operator=((string *)o_rDeviceName,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      bVar1 = IsForcePlateDevice(this,local_60->m_DeviceID);
      if (bVar1) {
        *(undefined4 *)Lock._8_8_ = 1;
      }
      else {
        bVar1 = IsEyeTrackerDevice(this,local_60->m_DeviceID);
        if (bVar1) {
          *(undefined4 *)Lock._8_8_ = 2;
        }
        else {
          *(undefined4 *)Lock._8_8_ = 0;
        }
      }
      this_local._4_4_ = Success;
    }
    else {
      this_local._4_4_ = InvalidIndex;
    }
  }
  else {
    this_local._4_4_ = local_44;
  }
  rDevice._0_4_ = 1;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetDeviceName( const unsigned int       i_DeviceIndex,
                                           std::string      & o_rDeviceName,
                                           DeviceType::Enum & o_rDeviceType ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceName, o_rDeviceType ) )
  {
    return GetResult; 
  }

  if( i_DeviceIndex >= m_LatestFrame.m_Devices.size() )
  {
    return Result::InvalidIndex;
  }

  const ViconCGStream::VDeviceInfo & rDevice( m_LatestFrame.m_Devices[ i_DeviceIndex ] );
  o_rDeviceName = AdaptDeviceName( rDevice.m_Name, rDevice.m_DeviceID );
  if( IsForcePlateDevice( rDevice.m_DeviceID ) )
  {
    o_rDeviceType = DeviceType::ForcePlate;
  }
  else if( IsEyeTrackerDevice( rDevice.m_DeviceID ) )
  {
    o_rDeviceType = DeviceType::EyeTracker;
  }
  else
  {
    o_rDeviceType = DeviceType::Unknown;
  }

  return Result::Success;
}